

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cxx::MessageGenerator::GenerateIsInitialized
          (MessageGenerator *this,Printer *printer)

{
  Descriptor *pDVar1;
  Printer *this_00;
  bool bVar2;
  char *__s;
  int bit;
  long lVar3;
  long lVar4;
  FieldDescriptor *field;
  uint value;
  int iVar5;
  ulong uVar6;
  long lVar7;
  allocator<char> local_c1;
  Printer *local_c0;
  MessageGenerator *local_b8;
  ulong local_b0;
  char buffer [32];
  string local_70;
  string local_50;
  
  io::Printer::Print(printer,"bool $classname$::IsInitialized() const {\n","classname",
                     &this->classname_);
  local_c0 = printer;
  io::Printer::Indent(printer);
  uVar6 = (long)(*(int *)(this->descriptor_ + 0x2c) + 0x1f) / 0x20;
  local_b0 = uVar6 & 0xffffffff;
  iVar5 = 0;
  if ((int)uVar6 < 1) {
    local_b0 = 0;
  }
  lVar7 = 0x30;
  local_b8 = this;
  for (uVar6 = 0; uVar6 != local_b0; uVar6 = uVar6 + 1) {
    value = 0;
    lVar4 = lVar7;
    for (lVar3 = 0; (lVar3 != 0x20 && (iVar5 + (int)lVar3 < *(int *)(local_b8->descriptor_ + 0x2c)))
        ; lVar3 = lVar3 + 1) {
      value = value | (uint)(*(int *)(*(long *)(local_b8->descriptor_ + 0x30) + lVar4) == 2) <<
                      ((byte)lVar3 & 0x1f);
      lVar4 = lVar4 + 0x78;
    }
    if (value != 0) {
      SimpleItoa_abi_cxx11_(&local_70,(protobuf *)(uVar6 & 0xffffffff),(int)lVar4);
      __s = FastHex32ToBuffer(value,buffer);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s,&local_c1);
      io::Printer::Print(local_c0,"if ((_has_bits_[$i$] & 0x$mask$) != 0x$mask$) return false;\n",
                         "i",&local_70,"mask",&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
    }
    lVar7 = lVar7 + 0xf00;
    iVar5 = iVar5 + 0x20;
  }
  io::Printer::Print(local_c0,"\n");
  lVar7 = 0;
  for (lVar4 = 0; this_00 = local_c0, pDVar1 = local_b8->descriptor_,
      lVar4 < *(int *)(pDVar1 + 0x2c); lVar4 = lVar4 + 1) {
    lVar3 = *(long *)(pDVar1 + 0x30);
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(lVar3 + 0x2c + lVar7) * 4) ==
        10) {
      pDVar1 = *(Descriptor **)(lVar3 + 0x48 + lVar7);
      hash_set<const_google::protobuf::Descriptor_*,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>_>
      ::hash_set((hash_set<const_google::protobuf::Descriptor_*,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>_>
                  *)buffer,0);
      bVar2 = anon_unknown_0::HasRequiredFields
                        (pDVar1,(hash_set<const_google::protobuf::Descriptor_*,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>_>
                                 *)buffer);
      std::tr1::
      _Hashtable<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>,_std::_Identity<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_true,_true>
      ::~_Hashtable((_Hashtable<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>,_std::_Identity<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_true,_true>
                     *)buffer);
      if (bVar2) {
        if (*(int *)(lVar3 + 0x30 + lVar7) == 3) {
          FieldName_abi_cxx11_((string *)buffer,(cxx *)(lVar7 + lVar3),field);
          io::Printer::Print(local_c0,
                             "for (int i = 0; i < $name$_size(); i++) {\n  if (!this->$name$(i).IsInitialized()) return false;\n}\n"
                             ,"name",(string *)buffer);
        }
        else {
          FieldName_abi_cxx11_((string *)buffer,(cxx *)(lVar7 + lVar3),field);
          io::Printer::Print(local_c0,
                             "if (has_$name$()) {\n  if (!this->$name$().IsInitialized()) return false;\n}\n"
                             ,"name",(string *)buffer);
        }
        std::__cxx11::string::~string((string *)buffer);
      }
    }
    lVar7 = lVar7 + 0x78;
  }
  if (0 < *(int *)(pDVar1 + 0x58)) {
    io::Printer::Print(local_c0,"\nif (!_extensions_.IsInitialized()) return false;");
  }
  io::Printer::Outdent(this_00);
  io::Printer::Print(this_00,"  return true;\n}\n");
  return;
}

Assistant:

void MessageGenerator::
GenerateIsInitialized(io::Printer* printer) {
  printer->Print(
    "bool $classname$::IsInitialized() const {\n",
    "classname", classname_);
  printer->Indent();

  // Check that all required fields in this message are set.  We can do this
  // most efficiently by checking 32 "has bits" at a time.
  int has_bits_array_size = (descriptor_->field_count() + 31) / 32;
  for (int i = 0; i < has_bits_array_size; i++) {
    uint32 mask = 0;
    for (int bit = 0; bit < 32; bit++) {
      int index = i * 32 + bit;
      if (index >= descriptor_->field_count()) break;
      const FieldDescriptor* field = descriptor_->field(index);

      if (field->is_required()) {
        mask |= 1 << bit;
      }
    }

    if (mask != 0) {
      char buffer[kFastToBufferSize];
      printer->Print(
        "if ((_has_bits_[$i$] & 0x$mask$) != 0x$mask$) return false;\n",
        "i", SimpleItoa(i),
        "mask", FastHex32ToBuffer(mask, buffer));
    }
  }

  // Now check that all embedded messages are initialized.
  printer->Print("\n");
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
        !ShouldIgnoreRequiredFieldCheck(field) &&
        HasRequiredFields(field->message_type())) {
      if (field->is_repeated()) {
        printer->Print(
          "for (int i = 0; i < $name$_size(); i++) {\n"
          "  if (!this->$name$(i).IsInitialized()) return false;\n"
          "}\n",
          "name", FieldName(field));
      } else {
        printer->Print(
          "if (has_$name$()) {\n"
          "  if (!this->$name$().IsInitialized()) return false;\n"
          "}\n",
          "name", FieldName(field));
      }
    }
  }

  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
      "\n"
      "if (!_extensions_.IsInitialized()) return false;");
  }

  printer->Outdent();
  printer->Print(
    "  return true;\n"
    "}\n");
}